

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,allocator<char> *temp_alloc)

{
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  basic_json_decode_options<wchar_t> *in_RDI;
  basic_json_parser<wchar_t,_std::allocator<char>_> *unaff_retaddr;
  basic_json_decode_options<wchar_t> *this_00;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_fffffffffffffeb0;
  default_json_parsing local_138 [288];
  allocator<char> *in_stack_ffffffffffffffe8;
  
  this_00 = (basic_json_decode_options<wchar_t> *)(local_138 + 0x20);
  basic_json_decode_options<wchar_t>::basic_json_decode_options(this_00);
  std::function<bool(jsoncons::json_errc,jsoncons::ser_context_const&)>::
  function<jsoncons::default_json_parsing,void>(in_stack_fffffffffffffeb0,local_138);
  basic_json_parser(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x65d52d);
  basic_json_decode_options<wchar_t>::~basic_json_decode_options(this_00);
  return;
}

Assistant:

basic_json_parser(const TempAllocator& temp_alloc = TempAllocator())
        : basic_json_parser(basic_json_decode_options<char_type>(), default_json_parsing(), temp_alloc)
    {
    }